

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

int __thiscall xmrig::OclBackendPrivate::init(OclBackendPrivate *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  pointer pOVar6;
  ulong uVar7;
  pointer extraout_RAX;
  char *reason;
  ulong uVar8;
  pointer pOVar9;
  OclPlatform OVar10;
  undefined1 local_60 [16];
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_50;
  pointer local_38;
  
  if (ctx[1] == (EVP_PKEY_CTX)0x0) {
    reason = "";
  }
  else {
    iVar5 = OclLib::init(*(EVP_PKEY_CTX **)(ctx + 0x20));
    if ((char)iVar5 != '\0') {
      if ((this->platform).m_id == (cl_platform_id)0x0) {
        OVar10 = OclConfig::platform((OclConfig *)ctx);
        this->platform = OVar10;
        if (OVar10.m_id == (cl_platform_id)0x0) {
          reason = "\x1b[0;31m (selected OpenCL platform NOT found)";
          goto LAB_0016c6c5;
        }
        OclPlatform::devices(&local_50,&this->platform);
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::_M_move_assign
                  (&this->devices,&local_50);
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_50);
        if ((this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          printDisabled("\x1b[0;31m (no devices)");
          iVar5 = extraout_EAX_00;
        }
        else {
          sVar2 = (this->platform).m_index;
          OclPlatform::name((OclPlatform *)&local_50);
          pOVar9 = local_50.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          OclPlatform::version((OclPlatform *)local_60);
          Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu \x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;37m%s\x1b[0m"
                     ,"OPENCL",sVar2,pOVar9,local_60._0_8_);
          String::~String((String *)local_60);
          String::~String((String *)&local_50);
          pOVar9 = (this->devices).
                   super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pOVar6 = (this->devices).
                   super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_38 = pOVar6;
          while( true ) {
            iVar5 = (int)pOVar6;
            if (pOVar9 == local_38) break;
            uVar1 = pOVar9->m_index;
            PciTopology::toString((PciTopology *)&local_50);
            pOVar6 = local_50.
                     super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl
                     .super__Vector_impl_data._M_start;
            OclDevice::printableName((OclDevice *)local_60);
            uVar4 = local_60._0_8_;
            uVar7 = OclDevice::clock(pOVar9);
            uVar3 = pOVar9->m_globalMemory;
            uVar8 = pOVar9->m_maxMemoryAlloc;
            if (uVar3 < pOVar9->m_maxMemoryAlloc) {
              uVar8 = uVar3;
            }
            Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu\x1b[0m\x1b[0;33m %s\x1b[0m %s \x1b[1;37m%u MHz\x1b[0m cu:\x1b[1;37m%u\x1b[0m mem:\x1b[0;36m%zu/%zu\x1b[0m MB"
                       ,"OPENCL GPU",(ulong)uVar1,pOVar6,uVar4,uVar7 & 0xffffffff,
                       (ulong)pOVar9->m_computeUnits,uVar8 >> 0x14,uVar3 >> 0x14);
            String::~String((String *)local_60);
            String::~String((String *)&local_50);
            pOVar9 = pOVar9 + 1;
            pOVar6 = extraout_RAX;
          }
        }
      }
      return iVar5;
    }
    reason = "\x1b[0;31m (failed to load OpenCL runtime)";
  }
LAB_0016c6c5:
  printDisabled(reason);
  return extraout_EAX;
}

Assistant:

void init(const OclConfig &cl)
    {
        if (!cl.isEnabled()) {
            return printDisabled("");
        }

        if (!OclLib::init(cl.loader())) {
            return printDisabled(RED_S " (failed to load OpenCL runtime)");
        }

        if (platform.isValid()) {
            return;
        }

        platform = cl.platform();
        if (!platform.isValid()) {
            return printDisabled(RED_S " (selected OpenCL platform NOT found)");
        }

        devices = platform.devices();
        if (devices.empty()) {
            return printDisabled(RED_S " (no devices)");
        }

        Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu ") WHITE_BOLD("%s") "/" WHITE_BOLD("%s"), "OPENCL", platform.index(), platform.name().data(), platform.version().data());

        for (const OclDevice &device : devices) {
            Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu") YELLOW(" %s") " %s " WHITE_BOLD("%u MHz") " cu:" WHITE_BOLD("%u") " mem:" CYAN("%zu/%zu") " MB",
                       "OPENCL GPU",
                       device.index(),
                       device.topology().toString().data(),
                       device.printableName().data(),
                       device.clock(),
                       device.computeUnits(),
                       device.freeMemSize() / oneMiB,
                       device.globalMemSize() / oneMiB);
        }
    }